

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbol(DescriptorBuilder *this,string *name,bool build_it)

{
  _Rb_tree_header *p_Var1;
  pointer file;
  DescriptorBuilder *pDVar2;
  bool bVar3;
  FileDescriptor *pFVar4;
  _Base_ptr p_Var5;
  undefined7 extraout_var;
  Symbol SVar6;
  _Base_ptr p_Var7;
  DescriptorBuilder *this_00;
  DescriptorBuilder *pDVar8;
  Symbol result;
  Symbol local_38;
  
  this_00 = (DescriptorBuilder *)&stack0xffffffffffffffc8;
  local_38 = FindSymbolNotEnforcingDeps(this,name,build_it);
  if (((local_38.ptr_ != (SymbolBase *)0x0) && ((local_38.ptr_)->symbol_type_ != '\0')) &&
     (this->pool_->enforce_dependencies_ == true)) {
    pFVar4 = Symbol::GetFile(&stack0xffffffffffffffc8);
    if (pFVar4 != this->file_) {
      p_Var1 = &(this->dependencies_)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = &p_Var1->_M_header;
      for (; p_Var7 != (_Base_ptr)0x0;
          p_Var7 = (&p_Var7->_M_left)[*(FileDescriptor **)(p_Var7 + 1) < pFVar4]) {
        if (*(FileDescriptor **)(p_Var7 + 1) >= pFVar4) {
          p_Var5 = p_Var7;
        }
      }
      p_Var7 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
         (p_Var7 = p_Var5, pFVar4 < *(FileDescriptor **)(p_Var5 + 1))) {
        p_Var7 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var7 == p_Var1) {
        if (((DescriptorBuilder *)local_38.ptr_ != (DescriptorBuilder *)0x0) &&
           ((local_38.ptr_)->symbol_type_ == 9)) {
          bVar3 = IsInPackage(this_00,this->file_,name);
          SVar6.ptr_ = (SymbolBase *)CONCAT71(extraout_var,bVar3);
          if (bVar3) {
            return (Symbol)local_38.ptr_;
          }
          pDVar2 = (DescriptorBuilder *)
                   (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          while ((pDVar8 = pDVar2, pDVar8 != (DescriptorBuilder *)p_Var1 &&
                 ((file = (pDVar8->options_to_interpret_).
                          super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                          ._M_impl.super__Vector_impl_data._M_finish, file == (pointer)0x0 ||
                  (bVar3 = IsInPackage(this_00,(FileDescriptor *)file,name),
                  SVar6.ptr_ = local_38.ptr_, !bVar3))))) {
            SVar6.ptr_ = (SymbolBase *)std::_Rb_tree_increment((_Rb_tree_node_base *)pDVar8);
            pDVar2 = (DescriptorBuilder *)SVar6.ptr_;
            this_00 = pDVar8;
          }
          if (pDVar8 != (DescriptorBuilder *)p_Var1) {
            return (Symbol)SVar6.ptr_;
          }
        }
        this->possible_undeclared_dependency_ = pFVar4;
        std::__cxx11::string::_M_assign((string *)&this->possible_undeclared_dependency_name_);
        local_38.ptr_ = (anonymous_namespace)::kNullSymbol;
      }
    }
  }
  return (Symbol)local_38.ptr_;
}

Assistant:

Symbol DescriptorBuilder::FindSymbol(const std::string& name, bool build_it) {
  Symbol result = FindSymbolNotEnforcingDeps(name, build_it);

  if (result.IsNull()) return result;

  if (!pool_->enforce_dependencies_) {
    // Hack for CompilerUpgrader, and also used for lazily_build_dependencies_
    return result;
  }

  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if (file == file_ || dependencies_.count(file) > 0) {
    return result;
  }

  if (result.type() == Symbol::PACKAGE) {
    // Arg, this is overcomplicated.  The symbol is a package name.  It could
    // be that the package was defined in multiple files.  result.GetFile()
    // returns the first file we saw that used this package.  We've determined
    // that that file is not a direct dependency of the file we are currently
    // building, but it could be that some other file which *is* a direct
    // dependency also defines the same package.  We can't really rule out this
    // symbol unless none of the dependencies define it.
    if (IsInPackage(file_, name)) return result;
    for (std::set<const FileDescriptor*>::const_iterator it =
             dependencies_.begin();
         it != dependencies_.end(); ++it) {
      // Note:  A dependency may be nullptr if it was not found or had errors.
      if (*it != nullptr && IsInPackage(*it, name)) return result;
    }
  }

  possible_undeclared_dependency_ = file;
  possible_undeclared_dependency_name_ = name;
  return kNullSymbol;
}